

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O1

void Ssw_ManUpdateEquivs(Ssw_Man_t *p,Aig_Man_t *pAig,int fVerbose)

{
  void *pvVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Vec_Ptr_t *__ptr;
  int iVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  
  __ptr = Aig_ManDfsNodes(pAig,(Aig_Obj_t **)
                               (pAig->vCos->pArray + ((long)pAig->nTruePos - (long)pAig->nConstrs)),
                          pAig->nConstrs);
  pVVar6 = pAig->vObjs;
  if (pVVar6->nSize < 1) {
    iVar4 = 0;
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    iVar4 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar5];
      if ((pvVar1 != (void *)0x0) &&
         ((uVar7 = (uint)*(undefined8 *)((long)pvVar1 + 0x18), (uVar7 & 7) == 2 ||
          (0xfffffffd < (uVar7 & 7) - 7)))) {
        pAVar2 = pAig->pReprs[lVar5];
        iVar4 = (iVar4 + 1) - (uint)(pAVar2 == (Aig_Obj_t *)0x0);
        if ((*(int *)((long)pvVar1 + 0x20) == pAig->nTravIds) &&
           (((pAVar2 != (Aig_Obj_t *)0x0 && (p->pPars->fConstrs != 0)) &&
            (p->pPars->fMergeFull == 0)))) {
          pAig->pReprs[lVar5] = (Aig_Obj_t *)0x0;
          iVar3 = iVar3 + 1;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar6 = pAig->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  p->nConesTotal = pAig->nObjs[5] + pAig->nObjs[2] + pAig->nObjs[6];
  p->nConesConstr = __ptr->nSize;
  p->nEquivsTotal = iVar4;
  p->nEquivsConstr = iVar3;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr == (Vec_Ptr_t *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Ssw_ManUpdateEquivs( Ssw_Man_t * p, Aig_Man_t * pAig, int fVerbose )
{
    Vec_Ptr_t * vCones;
    Aig_Obj_t ** pArray;
    Aig_Obj_t * pObj;
    int i, nTotal = 0, nRemoved = 0;
    // collect the nodes in the cone of constraints
    pArray  = (Aig_Obj_t **)Vec_PtrArray(pAig->vCos);
    pArray += Saig_ManPoNum(pAig) - Saig_ManConstrNum(pAig);
    vCones  = Aig_ManDfsNodes( pAig, pArray, Saig_ManConstrNum(pAig) );
    // remove all the node that are equiv to something and are in the cones
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        if ( pAig->pReprs[i] != NULL )
            nTotal++;
        if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
            continue;
        if ( pAig->pReprs[i] )
        {
            if ( p->pPars->fConstrs && !p->pPars->fMergeFull )
            {
                pAig->pReprs[i] = NULL;
                nRemoved++;
            }
        }
    }
    // collect statistics    
    p->nConesTotal   = Aig_ManCiNum(pAig) + Aig_ManNodeNum(pAig);
    p->nConesConstr  = Vec_PtrSize(vCones);
    p->nEquivsTotal  = nTotal;
    p->nEquivsConstr = nRemoved;
    Vec_PtrFree( vCones );
}